

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O0

void __thiscall ArchiveSpan_ReadSpan_Test::TestBody(ArchiveSpan_ReadSpan_Test *this)

{
  bool bVar1;
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *this_00;
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *this_01;
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_02;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_03;
  MockSpec<void_(int_&)> *this_04;
  TypedExpectation<void_(int_&)> *this_05;
  MockSpec<void_(pstore::gsl::span<int,__1L>)> *this_06;
  TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this_07;
  char *message;
  type tVar2;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<int,_3UL>_>_> matcher;
  AssertHelper local_320;
  Message local_318;
  StlContainer local_310;
  ContainerEqMatcher<std::array<int,_3UL>_> local_300;
  _Type local_2f0;
  _Type local_2e0;
  StlContainer local_2d0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar;
  undefined1 local_2a4 [8];
  array<int,_3UL> arr;
  pointer local_288;
  int local_280;
  type local_278;
  Action<void_(pstore::gsl::span<int,__1L>)> local_268;
  WithoutMatchers local_241;
  Matcher<pstore::gsl::span<int,__1L>_> local_240;
  MockSpec<void_(pstore::gsl::span<int,__1L>)> local_228;
  WithoutMatchers local_201;
  Matcher<int_&> local_200;
  MockSpec<void_(int_&)> local_1e8;
  WithoutMatchers local_1c1;
  Matcher<pstore::gsl::span<int,__1L>_> local_1c0;
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> local_1a8;
  WithoutMatchers local_185 [13];
  Matcher<const_int_&> local_178;
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> local_160;
  undefined1 local_140 [8];
  mock_span_archive archive;
  array<int,_3UL> expected;
  ArchiveSpan_ReadSpan_Test *this_local;
  
  archive.gmock01_getn_mock_286.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x110000000d;
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::mock_span_archive
            ((mock_span_archive *)local_140);
  testing::Matcher<int_const&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<int_const&> *)&local_178,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_put
            (&local_160,(mock_span_archive *)local_140,&local_178);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
            operator()(&local_160,local_185,(void *)0x0);
  this_01 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x153,"archive","put (_)");
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::Times
            (this_01,0);
  testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::~MockSpec
            (&local_160);
  testing::Matcher<const_int_&>::~Matcher(&local_178);
  testing::Matcher<pstore::gsl::span<int,-1l>>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<int,_1l>> *)&local_1c0,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_putn_mock
            (&local_1a8,(mock_span_archive *)local_140,&local_1c0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            operator()(&local_1a8,&local_1c1,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            InternalExpectedAt(this_02,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x154,"archive","putn_mock (_)");
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
            (this_03,0);
  testing::internal::MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
  ~MockSpec(&local_1a8);
  testing::Matcher<pstore::gsl::span<int,_-1L>_>::~Matcher(&local_1c0);
  testing::Matcher<int&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<int&> *)&local_200,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_get
            (&local_1e8,(mock_span_archive *)local_140,&local_200);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::MockSpec<void_(int_&)>::operator()(&local_1e8,&local_201,(void *)0x0)
  ;
  this_05 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x155,"archive","get (_)");
  testing::internal::TypedExpectation<void_(int_&)>::Times(this_05,0);
  testing::internal::MockSpec<void_(int_&)>::~MockSpec(&local_1e8);
  testing::Matcher<int_&>::~Matcher(&local_200);
  testing::Matcher<pstore::gsl::span<int,-1l>>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<int,_1l>> *)&local_240,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_getn_mock
            (&local_228,(mock_span_archive *)local_140,&local_240);
  testing::internal::GetWithoutMatchers();
  this_06 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::operator()
                      (&local_228,&local_241,(void *)0x0);
  this_07 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::InternalExpectedAt
                      (this_06,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x156,"archive","getn_mock (_)");
  local_280 = 0x13;
  local_288 = archive.gmock01_getn_mock_286.super_UntypedFunctionMockerBase.untyped_expectations_.
              super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tVar2 = testing::Invoke<ArchiveSpan_ReadSpan_Test::TestBody()::__0>((type *)&local_288);
  local_278.expected._M_elems[2] = tVar2.expected._M_elems[2];
  arr._M_elems._4_8_ = tVar2.expected._M_elems._0_8_;
  local_278.expected._M_elems._0_8_ = arr._M_elems._4_8_;
  testing::Action<void(pstore::gsl::span<int,-1l>)>::
  Action<ArchiveSpan_ReadSpan_Test::TestBody()::__0,void>
            ((Action<void(pstore::gsl::span<int,_1l>)> *)&local_268,&local_278);
  testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::WillOnce
            (this_07,&local_268);
  testing::Action<void_(pstore::gsl::span<int,_-1L>)>::~Action(&local_268);
  testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::~MockSpec(&local_228);
  testing::Matcher<pstore::gsl::span<int,_-1L>_>::~Matcher(&local_240);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,3ul>((array<int,_3UL> *)local_2a4);
  pstore::serialize::read<(anonymous_namespace)::ArchiveSpan::mock_span_archive&,int,3l>
            ((mock_span_archive *)local_140,
             (span<int,_3L>)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  local_300.expected_._M_elems =
       (StlContainer)
       testing::ContainerEq<std::array<int,3ul>>
                 ((array<int,_3UL> *)
                  ((long)&archive.gmock01_getn_mock_286.super_UntypedFunctionMockerBase.
                          untyped_expectations_.
                          super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                          ._M_impl.super__Vector_impl_data + 0x10));
  matcher.impl_.expected_._M_elems[2] = local_300.expected_._M_elems[2];
  matcher.impl_.expected_._M_elems[1] = 0;
  matcher.impl_.expected_._M_elems[0] = matcher.impl_.expected_._M_elems[2];
  local_2f0 = (_Type)local_300.expected_._M_elems;
  local_2e0 = (_Type)local_300.expected_._M_elems;
  local_310._M_elems =
       (_Type)testing::internal::
              MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<int,3ul>>>>
                        (local_300.expected_._M_elems._0_8_,matcher);
  local_2d0._M_elems = local_310._M_elems;
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<int,3ul>>>>
  ::operator()(local_2c0,(char *)&local_2d0,(array<int,_3UL> *)"arr");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
               ,0x15d,message);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::~mock_span_archive
            ((mock_span_archive *)local_140);
  return;
}

Assistant:

TEST_F (ArchiveSpan, ReadSpan) {
    using ::testing::_;
    using ::testing::ContainerEq;
    using ::testing::Invoke;

    std::array<int, 3> const expected{{13, 17, 19}};

    mock_span_archive archive;
    EXPECT_CALL (archive, put (_)).Times (0);
    EXPECT_CALL (archive, putn_mock (_)).Times (0);
    EXPECT_CALL (archive, get (_)).Times (0);
    EXPECT_CALL (archive, getn_mock (_))
        .WillOnce (Invoke ([expected] (::pstore::gsl::span<int> sp) {
            std::copy (std::begin (expected), std::end (expected), std::begin (sp));
        }));

    std::array<int, 3> arr;
    pstore::serialize::read (archive, pstore::gsl::make_span (arr));
    EXPECT_THAT (arr, ContainerEq (expected));
}